

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall
fasttext::ProductQuantizer::compute_code(ProductQuantizer *this,real *x,uint8_t *code)

{
  int iVar1;
  real *c0;
  int32_t d;
  int m;
  ulong uVar2;
  
  d = this->dsub_;
  for (uVar2 = 0; (long)uVar2 < (long)this->nsubq_; uVar2 = uVar2 + 1) {
    if (uVar2 == this->nsubq_ - 1) {
      d = this->lastdsub_;
    }
    iVar1 = this->dsub_;
    c0 = get_centroids(this,(int)uVar2,'\0');
    assign_centroid(this,x + (long)iVar1 * (long)(int)uVar2,c0,code + uVar2,d);
  }
  return;
}

Assistant:

void ProductQuantizer::compute_code(const real* x, uint8_t* code) const {
  auto d = dsub_;
  for (auto m = 0; m < nsubq_; m++) {
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    assign_centroid(x + m * dsub_, get_centroids(m, 0), code + m, d);
  }
}